

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<float,_int,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<float,_int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,
          float *key,int *value)

{
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_> *__first;
  bool bVar1;
  idx_t iVar2;
  pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_> pVar3;
  ulong __holeIndex;
  STORAGE_TYPE *__first_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_>_&)>
  local_20;
  
  __first_00 = this->heap;
  __holeIndex = this->size;
  if (__holeIndex < this->capacity) {
    __first_00[__holeIndex].first.value = *key;
    __first_00[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    pVar3 = __first_00[__holeIndex];
  }
  else {
    bVar1 = GreaterThan::Operation<float>(key,(float *)__first_00);
    if (!bVar1) {
      return;
    }
    iVar2 = this->size;
    if (1 < (long)iVar2) {
      __first = this->heap;
      pVar3 = __first[iVar2 - 1];
      __first[iVar2 - 1] = *__first;
      ::std::
      __adjust_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>*,long,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&)>>
                (__first,0,(long)(iVar2 * 8 + -8) >> 3,pVar3,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_>_&,_const_std::pair<duckdb::HeapEntry<float>,_duckdb::HeapEntry<int>_>_&)>
                  )Compare);
      iVar2 = this->size;
    }
    __first_00 = this->heap;
    __first_00[iVar2 - 1].first.value = *key;
    __first_00[iVar2 - 1].second.value = *value;
    pVar3 = __first_00[iVar2 - 1];
    __holeIndex = ((long)(iVar2 * 8) >> 3) - 1;
  }
  local_20._M_comp = Compare;
  ::std::
  __push_heap<std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>*,long,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&,std::pair<duckdb::HeapEntry<float>,duckdb::HeapEntry<int>>const&)>>
            (__first_00,__holeIndex,0,pVar3,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}